

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O1

void __thiscall adios2::format::BP4Serializer::SerializeDataBuffer(BP4Serializer *this,IO *io)

{
  undefined1 *this_00;
  long *plVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  string local_70;
  string local_50;
  
  p_Var2 = (this->super_BP4Base)._vptr_BP4Base[-3];
  *(undefined4 *)
   (*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
   *(long *)(&(this->super_BP4Base).field_0x1b8 + (long)p_Var2)) =
       *(undefined4 *)(&(this->super_BP4Base).field_0x1b0 + (long)p_Var2);
  plVar1 = (long *)(&(this->super_BP4Base).field_0x1b8 + (long)p_Var2);
  *plVar1 = *plVar1 + 4;
  p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  lVar4 = *(long *)(&(this->super_BP4Base).field_0x1b8 + (long)p_Var3);
  *(long *)(*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
           lVar4) =
       (*(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) - lVar4
       ) + -8;
  plVar1 = (long *)(&(this->super_BP4Base).field_0x1b8 + (long)p_Var3);
  *plVar1 = *plVar1 + 8;
  this_00 = &(this->super_BP4Base).field_0xa0;
  sVar5 = BPSerializer::GetAttributesSizeInData((BPSerializer *)this_00,io);
  if (sVar5 == 0) {
    uVar6 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
            0x10;
    p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
    if ((ulong)(*(long *)(p_Var3 + 0x38 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)
               - *(long *)(p_Var3 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer
                          )) < uVar6) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"for empty Attributes\n","");
      BufferSTL::Resize((BufferSTL *)
                        (p_Var3 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h),
                        uVar6,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar4 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer + 8)
    ;
    *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
         *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 0xc;
    *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer + 8) =
         lVar4 + 0xc;
  }
  else {
    uVar6 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
            sVar5 + 0x10;
    p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
    if ((ulong)(*(long *)(p_Var3 + 0x38 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)
               - *(long *)(p_Var3 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer
                          )) < uVar6) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"when writing Attributes in rank=0\n","");
      BufferSTL::Resize((BufferSTL *)
                        (p_Var3 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h),
                        uVar6,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    BPSerializer::PutAttributes((BPSerializer *)this_00,io);
  }
  *(undefined4 *)
   (*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
   *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)) =
       0x5d494750;
  lVar4 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer + 8);
  lVar7 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 4;
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) = lVar7;
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer + 8) =
       lVar4 + 4;
  p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  lVar4 = *(long *)(&(this->super_BP4Base).field_0x1a8 + (long)p_Var3);
  *(long *)(*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
           lVar4) = lVar7 - lVar4;
  plVar1 = (long *)(&(this->super_BP4Base).field_0x1a8 + (long)p_Var3);
  *plVar1 = *plVar1 + 8;
  (&(this->super_BP4Base).field_0x1c0)[(long)(this->super_BP4Base)._vptr_BP4Base[-3]] = 0;
  return;
}

Assistant:

void BP4Serializer::SerializeDataBuffer(core::IO &io) noexcept
{
    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // vars count and Length (only for PG)
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition,
                         &m_MetadataSet.DataPGVarsCount);
    // without record itself and vars count
    // Note: m_MetadataSet.DataPGVarsCount has been incremented by 4
    // in previous CopyToBuffer operation!
    const uint64_t varsLength = position - m_MetadataSet.DataPGVarsCountPosition - 8;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition, &varsLength);

    // each attribute is only written to output once
    size_t attributesSizeInData = GetAttributesSizeInData(io);
    if (attributesSizeInData)
    {
        attributesSizeInData += 12; // count + length + end ID
        // Take care not to shrink the buffer size in this.
        // Otherwise, growing the buffer again later on is expensive
        // - not because of reallocation, but because of (re)initialization
        // with zeros by BufferSTL::Resize.
        const size_t minSize = position + attributesSizeInData + 4;
        if (m_Data.m_Buffer.size() < minSize)
        {
            m_Data.Resize(minSize, "when writing Attributes in rank=0\n");
        }
        PutAttributes(io);
    }
    else
    {
        const size_t minSize = position + 12 + 4;
        if (m_Data.m_Buffer.size() < minSize)
        {
            m_Data.Resize(minSize, "for empty Attributes\n");
        }
        // Attribute index header for zero attributes: 0, 0LL
        // Resize() already takes care of this
        position += 12;
        absolutePosition += 12;
    }

    // write a block identifier PGI]
    const char pgiend[] = "PGI]"; // no \0
    helper::CopyToBuffer(buffer, position, pgiend, sizeof(pgiend) - 1);
    absolutePosition += sizeof(pgiend) - 1;

    // Finish writing pg group length INCLUDING the record itself and
    // including the closing padding but NOT the opening [PGI
    const uint64_t dataPGLength = position - m_MetadataSet.DataPGLengthPosition;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGLengthPosition, &dataPGLength);

    m_MetadataSet.DataPGIsOpen = false;
}